

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketServer.cpp
# Opt level: O1

void __thiscall asl::SocketServer::~SocketServer(SocketServer *this)

{
  this->_vptr_SocketServer = (_func_int **)&PTR_serve_00152870;
  if (this->_thread != (SockServerThread *)0x0) {
    pthread_cancel((this->_thread->super_Thread)._thread);
    if (this->_thread != (SockServerThread *)0x0) {
      (*(this->_thread->super_Thread)._vptr_Thread[1])();
    }
  }
  if ((this->_socketError)._size != 0) {
    free((this->_socketError).field_2._str);
  }
  Array<asl::Socket>::~Array(&(this->_sockets).changed);
  Array<asl::Socket>::~Array(&(this->_sockets).set);
  return;
}

Assistant:

SocketServer::~SocketServer()
{
	if(_thread) {
		_thread->kill();
		delete _thread;
	}
}